

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledInputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_4::TiledInputFile::TiledInputFile
          (TiledInputFile *this,char *filename,ContextInitializer *ctxtinit,int numThreads)

{
  undefined4 in_ECX;
  Context **in_RDX;
  undefined8 in_RSI;
  Context *in_RDI;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 uVar1;
  undefined4 in_stack_ffffffffffffffe0;
  
  Context::Context(in_RDI,in_RSI,in_RDX);
  uVar1 = 0;
  std::make_shared<Imf_3_4::TiledInputFile::Data,Imf_3_4::Context*,int,int&>
            (in_RDX,(int *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),(int *)in_RDI);
  std::__shared_ptr_access<Imf_3_4::TiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<Imf_3_4::TiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x234dc8);
  Data::initialize((Data *)CONCAT44(uVar1,in_stack_ffffffffffffffd0));
  return;
}

Assistant:

TiledInputFile::TiledInputFile (
    const char*               filename,
    const ContextInitializer& ctxtinit,
    int                       numThreads)
    : _ctxt (filename, ctxtinit, Context::read_mode_t{})
    , _data (std::make_shared<Data> (&_ctxt, 0, numThreads))
{
    _data->initialize ();
}